

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_> *
__thiscall
wallet::SelectionResult::GetShuffledInputVector
          (vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           *__return_storage_ptr__,SelectionResult *this)

{
  __normal_iterator<std::shared_ptr<wallet::COutput>_*,_std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<wallet::COutput>_*,_std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>_>
  __last;
  long in_FS_OFFSET;
  FastRandomContext local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>::
  vector<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>,void>
            ((vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>
              *)__return_storage_ptr__,
             (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>)
             &(this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header,
             (allocator_type *)&local_b0);
  __first._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  FastRandomContext::FastRandomContext(&local_b0,false);
  std::
  shuffle<__gnu_cxx::__normal_iterator<std::shared_ptr<wallet::COutput>*,std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>,FastRandomContext>
            (__first,__last,&local_b0);
  ChaCha20::~ChaCha20(&local_b0.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::shared_ptr<COutput>> SelectionResult::GetShuffledInputVector() const
{
    std::vector<std::shared_ptr<COutput>> coins(m_selected_inputs.begin(), m_selected_inputs.end());
    std::shuffle(coins.begin(), coins.end(), FastRandomContext());
    return coins;
}